

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O2

void __thiscall argo::unparser::unparse(unparser *this,json *j,int indent_level)

{
  bool bVar1;
  type tVar2;
  int i;
  string *psVar3;
  writer *pwVar4;
  json_exception *this_00;
  char *pcVar5;
  double d;
  allocator local_41;
  string local_40;
  
  psVar3 = json::get_raw_value_abi_cxx11_(j);
  bVar1 = std::operator==(psVar3,"");
  tVar2 = json::get_instance_type(j);
  if (bVar1) {
    switch(tVar2) {
    case object_e:
      unparse_object(this,j,indent_level);
      return;
    case array_e:
      unparse_array(this,j,indent_level);
      return;
    case boolean_e:
      pwVar4 = this->m_writer;
      bVar1 = json::operator_cast_to_bool(j);
      pcVar5 = "false";
      if (bVar1) {
        pcVar5 = "true";
      }
      std::__cxx11::string::string((string *)&local_40,pcVar5,&local_41);
      operator<<(pwVar4,&local_40);
      break;
    case null_e:
      pwVar4 = this->m_writer;
      std::__cxx11::string::string((string *)&local_40,"null",&local_41);
      operator<<(pwVar4,&local_40);
      break;
    case number_int_e:
      pwVar4 = this->m_writer;
      i = json::operator_cast_to_int(j);
      operator<<(pwVar4,i);
      return;
    case number_double_e:
      pwVar4 = this->m_writer;
      d = json::operator_cast_to_double(j);
      operator<<(pwVar4,d);
      return;
    case string_e:
      pwVar4 = operator<<(this->m_writer,'\"');
      psVar3 = json::operator_cast_to_string_(j);
      utf8::utf8_to_json_string((utf8 *)&local_40,psVar3);
      pwVar4 = operator<<(pwVar4,(string *)local_40._M_dataplus._M_p);
      operator<<(pwVar4,'\"');
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_40);
      return;
    default:
      this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
      json_exception::json_exception(this_00,invalid_json_type_e);
      __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
    }
    std::__cxx11::string::~string((string *)&local_40);
    return;
  }
  pwVar4 = this->m_writer;
  if (tVar2 == string_e) {
    pwVar4 = operator<<(pwVar4,'\"');
    psVar3 = json::get_raw_value_abi_cxx11_(j);
    pwVar4 = operator<<(pwVar4,psVar3);
    operator<<(pwVar4,'\"');
    return;
  }
  psVar3 = json::get_raw_value_abi_cxx11_(j);
  operator<<(pwVar4,psVar3);
  return;
}

Assistant:

void unparser::unparse(const json &j, int indent_level)
{
    if (j.get_raw_value() == "")
    {
        switch (j.get_instance_type())
        {
        case json::object_e:
            unparse_object(j, indent_level);
            break;
        case json::array_e:
            unparse_array(j, indent_level);
            break;
        case json::boolean_e:
            m_writer << (static_cast<bool>(j) ? "true" : "false");
            break;
        case json::null_e:
            m_writer << "null";
            break;
        case json::number_int_e:
            m_writer << static_cast<int>(j);
            break;
        case json::number_double_e:
            m_writer << static_cast<double>(j);
            break;
        case json::string_e:
            m_writer << '"' << *(utf8::utf8_to_json_string(j)) << '"';
            break;
        default:
            throw json_exception(json_exception::invalid_json_type_e);
        }
    }
    else
    {
        if (j.get_instance_type() == json::string_e)
        {
            m_writer << '"' << j.get_raw_value() << '"';
        }
        else
        {
            m_writer << j.get_raw_value();
        }
    }
}